

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O1

void __thiscall QProgressDialog::reset(QProgressDialog *this)

{
  long lVar1;
  long in_FS_OFFSET;
  void *local_38;
  char *pcStack_30;
  QMetaTypeInterface *local_28 [2];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  if ((*(char *)(lVar1 + 0x34a) != '\0') || (*(char *)(lVar1 + 0x34c) == '\x01')) {
    QWidget::hide((QWidget *)this);
  }
  QProgressBar::reset(*(QProgressBar **)(lVar1 + 0x2f0));
  *(undefined2 *)(lVar1 + 0x34d) = 0;
  *(undefined1 *)(lVar1 + 0x349) = 0;
  QTimer::stop();
  if (((*(long *)(lVar1 + 0x308) != 0) && (*(int *)(*(long *)(lVar1 + 0x308) + 4) != 0)) &&
     (*(long *)(lVar1 + 0x310) != 0)) {
    local_38 = (void *)0x0;
    pcStack_30 = (char *)0x0;
    local_28[0] = (QMetaTypeInterface *)0x0;
    QMetaObject::invokeMethodImpl
              ((QObject *)this,"_q_disconnectOnClose",QueuedConnection,1,&local_38,&pcStack_30,
               local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProgressDialog::reset()
{
    Q_D(QProgressDialog);
    if (d->autoClose || d->forceHide)
        hide();
    d->bar->reset();
    d->cancellationFlag = false;
    d->shownOnce = false;
    d->setValueCalled = false;
    d->forceTimer->stop();

    /*
        I wish we could disconnect the user slot provided to open() here but
        unfortunately reset() is usually called before the slot has been invoked.
        (reset() is itself invoked when canceled() is emitted.)
    */
    if (d->receiverToDisconnectOnClose)
        QMetaObject::invokeMethod(this, "_q_disconnectOnClose", Qt::QueuedConnection);
}